

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
* wallet::ListCoins(map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                    *__return_storage_ptr__,CWallet *wallet)

{
  _Rb_tree_header *p_Var1;
  undefined1 auVar2 [16];
  bool bVar3;
  LegacyScriptPubKeyMan *pLVar4;
  CTxOut *pCVar5;
  vector<wallet::COutput,std::allocator<wallet::COutput>> *this;
  CCoinControl *in_RCX;
  pointer __args;
  long in_FS_OFFSET;
  CTxDestination address;
  CCoinControl coin_control;
  CoinFilterParams *in_stack_fffffffffffffd48;
  vector<wallet::COutput,_std::allocator<wallet::COutput>_> local_2b0;
  undefined8 local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 local_280;
  undefined2 local_278;
  undefined1 local_276;
  PKHash local_26c;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_258;
  char local_210;
  undefined1 local_208 [464];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  CCoinControl::CCoinControl((CCoinControl *)local_208);
  pLVar4 = CWallet::GetLegacyScriptPubKeyMan(wallet);
  if (pLVar4 == (LegacyScriptPubKeyMan *)0x0) {
    local_208[0x5a] = false;
  }
  else {
    local_208[0x5a] = CWallet::IsWalletFlagSet(wallet,0x100000000);
  }
  local_298 = 1;
  local_290 = 2100000000000000;
  local_288 = 2100000000000000;
  local_280 = 0;
  local_278 = 0;
  local_276 = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = &local_298;
  AvailableCoins((CoinsResult *)&local_258._M_first,(wallet *)wallet,(CWallet *)local_208,in_RCX,
                 (optional<CFeeRate>)(auVar2 << 0x40),in_stack_fffffffffffffd48);
  CoinsResult::All(&local_2b0,(CoinsResult *)&local_258._M_first);
  _GLOBAL__N_1::std::
  _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&local_258._M_first);
  __args = local_2b0.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (__args == local_2b0.super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      _GLOBAL__N_1::std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector
                ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)&local_2b0);
      CCoinControl::~CCoinControl((CCoinControl *)local_208);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    local_258._16_8_ = 0;
    local_258._24_8_ = 0;
    local_258._0_8_ = 0;
    local_258._8_8_ = 0;
    local_210 = '\0';
    if (__args->spendable == false) {
      bVar3 = CWallet::IsWalletFlagSet(wallet,0x100000000);
      if ((bVar3) && (__args->solvable == true)) goto LAB_0044dd34;
    }
    else {
LAB_0044dd34:
      pCVar5 = FindNonChangeParentOutput(wallet,&__args->outpoint);
      bVar3 = ExtractDestination(&pCVar5->scriptPubKey,(CTxDestination *)&local_258._M_first);
      if (!bVar3) {
        if (local_210 != '\x01') goto LAB_0044ddaf;
        PKHash::PKHash(&local_26c,(CPubKey *)&local_258._M_first);
        std::
        variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
        ::operator=((variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                     *)&local_258._M_first,&local_26c);
      }
      this = (vector<wallet::COutput,std::allocator<wallet::COutput>> *)
             std::
             map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
             ::operator[](__return_storage_ptr__,(key_type *)&local_258._M_first);
      std::vector<wallet::COutput,std::allocator<wallet::COutput>>::
      emplace_back<wallet::COutput_const&>(this,__args);
    }
LAB_0044ddaf:
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&local_258._M_first);
    __args = __args + 1;
  } while( true );
}

Assistant:

std::map<CTxDestination, std::vector<COutput>> ListCoins(const CWallet& wallet)
{
    AssertLockHeld(wallet.cs_wallet);

    std::map<CTxDestination, std::vector<COutput>> result;

    CCoinControl coin_control;
    // Include watch-only for LegacyScriptPubKeyMan wallets without private keys
    coin_control.fAllowWatchOnly = wallet.GetLegacyScriptPubKeyMan() && wallet.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS);
    CoinFilterParams coins_params;
    coins_params.only_spendable = false;
    coins_params.skip_locked = false;
    for (const COutput& coin : AvailableCoins(wallet, &coin_control, /*feerate=*/std::nullopt, coins_params).All()) {
        CTxDestination address;
        if ((coin.spendable || (wallet.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS) && coin.solvable))) {
            if (!ExtractDestination(FindNonChangeParentOutput(wallet, coin.outpoint).scriptPubKey, address)) {
                // For backwards compatibility, we convert P2PK output scripts into PKHash destinations
                if (auto pk_dest = std::get_if<PubKeyDestination>(&address)) {
                    address = PKHash(pk_dest->GetPubKey());
                } else {
                    continue;
                }
            }
            result[address].emplace_back(coin);
        }
    }
    return result;
}